

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O1

float __thiscall masc::polygon::c_ply::getArcLength(c_ply *this)

{
  double dVar1;
  int i_1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int i;
  long lVar5;
  ply_vertex *ppVar6;
  double sumsqr;
  double local_28 [2];
  ply_vertex *ppVar4;
  
  if ((this->arclength == -3.4028235e+38) && (!NAN(this->arclength))) {
    this->arclength = 0.0;
    ppVar6 = this->head;
    do {
      iVar2 = (*ppVar6->_vptr_ply_vertex[3])(ppVar6);
      ppVar4 = (ply_vertex *)CONCAT44(extraout_var,iVar2);
      iVar2 = (*ppVar6->_vptr_ply_vertex[2])(ppVar6);
      iVar3 = (*ppVar4->_vptr_ply_vertex[2])(ppVar4);
      local_28[0] = 0.0;
      local_28[1] = 0.0;
      lVar5 = 0;
      do {
        local_28[lVar5] =
             *(double *)(CONCAT44(extraout_var_00,iVar2) + lVar5 * 8) -
             *(double *)(CONCAT44(extraout_var_01,iVar3) + lVar5 * 8);
        lVar5 = lVar5 + 1;
      } while (lVar5 == 1);
      dVar1 = 0.0;
      lVar5 = 0;
      do {
        dVar1 = dVar1 + local_28[lVar5] * local_28[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 == 1);
      if (dVar1 < 0.0) {
        dVar1 = sqrt(dVar1);
      }
      else {
        dVar1 = SQRT(dVar1);
      }
      this->arclength = (float)((double)this->arclength + dVar1);
      ppVar6 = ppVar4;
    } while (ppVar4 != this->head);
  }
  return this->arclength;
}

Assistant:

float c_ply::getArcLength()
{
	if (arclength == -FLT_MAX){
		arclength = 0;
		ply_vertex * ptr = head;
		do{
			ply_vertex * next = ptr->getNext();
			const Point2d& p1 = ptr->getPos();
			const Point2d& p2 = next->getPos();
			arclength += (p1 - p2).norm();
			ptr = next;
		} while (ptr != head); //end while
	}

	return arclength;
}